

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTPrinter.cc
# Opt level: O3

int __thiscall
flow::lang::ASTPrinter::accept(ASTPrinter *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  long *plVar1;
  undefined8 *puVar2;
  int iVar3;
  undefined4 in_register_00000034;
  unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_> *symbol;
  undefined8 *puVar4;
  
  printf<char_const*>(this,"Unit: %s\n",*(char **)(CONCAT44(in_register_00000034,__fd) + 0x48));
  iVar3 = this->depth_;
  this->depth_ = iVar3 + 1;
  plVar1 = *(long **)(CONCAT44(in_register_00000034,__fd) + 0x70);
  puVar4 = (undefined8 *)*plVar1;
  puVar2 = (undefined8 *)plVar1[1];
  if (puVar4 != puVar2) {
    do {
      (**(code **)(*(long *)*puVar4 + 0x10))((long *)*puVar4,this);
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar2);
    iVar3 = this->depth_ + -1;
  }
  this->depth_ = iVar3;
  return iVar3;
}

Assistant:

void ASTPrinter::accept(UnitSym& unit) {
  printf("Unit: %s\n", unit.name().c_str());

  enter();
  for (std::unique_ptr<Symbol>& symbol : *unit.scope())
    symbol->visit(*this);

  leave();
}